

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

ON_String __thiscall ON_String::Mid(ON_String *this,int i,int count)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ON_Internal_Empty_aString *pOVar4;
  int in_ECX;
  undefined4 in_register_00000034;
  
  ON_String(this);
  if (-1 < count) {
    lVar2 = *(long *)CONCAT44(in_register_00000034,i);
    pOVar4 = &empty_astring;
    if (lVar2 != 0) {
      pOVar4 = (ON_Internal_Empty_aString *)(lVar2 + -0xc);
    }
    if ((0 < in_ECX) &&
       (iVar1 = (pOVar4->header).string_length, iVar3 = iVar1 - count, iVar3 != 0 && count <= iVar1)
       ) {
      if (iVar3 < in_ECX) {
        in_ECX = iVar3;
      }
      CopyToArray(this,in_ECX,(char *)(lVar2 + (ulong)(uint)count));
    }
  }
  return (ON_String)(char *)this;
}

Assistant:

ON_String ON_String::Mid(int i, int count) const
{
  ON_String(s);
  if ( i >= 0 && i < Length() && count > 0 ) {
    if ( count > Length() - i )
      count = Length() - i;
    s.CopyToArray( count, &m_s[i] );
  }
  return s;
}